

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int element1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  
  if (tok == 0xf) {
    return 0x27;
  }
  if (tok == 0x17) {
    state->handler = element2;
    state->level = 1;
    return 0x2c;
  }
  if (tok == 0x12) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"EMPTY");
    if (iVar1 != 0) {
      state->handler = declClose;
      state->role_none = 0x27;
      return 0x2a;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"ANY");
    if (iVar1 != 0) {
      state->handler = declClose;
      state->role_none = 0x27;
      return 0x29;
    }
  }
  else if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x3b;
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
element1(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_EMPTY)) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
      return XML_ROLE_CONTENT_EMPTY;
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_ANY)) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
      return XML_ROLE_CONTENT_ANY;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->handler = element2;
    state->level = 1;
    return XML_ROLE_GROUP_OPEN;
  }
  return common(state, tok);
}